

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O3

int __thiscall btConvexHullInternal::Face::init(Face *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long in_RCX;
  long in_RDX;
  ulong uVar6;
  EVP_PKEY_CTX *pEVar7;
  
  this->nearbyVertex = (Vertex *)ctx;
  uVar4 = *(undefined8 *)(ctx + 0x68);
  uVar5 = *(undefined8 *)(ctx + 0x70);
  (this->origin).x = (int)uVar4;
  (this->origin).y = (int)((ulong)uVar4 >> 0x20);
  (this->origin).z = (int)uVar5;
  (this->origin).index = (int)((ulong)uVar5 >> 0x20);
  iVar1 = *(int *)(in_RDX + 0x6c);
  iVar2 = *(int *)(ctx + 0x6c);
  uVar6 = (ulong)(uint)(*(int *)(in_RDX + 0x70) - *(int *)(ctx + 0x70)) | 0xffffffff00000000;
  (this->dir0).x = *(int *)(in_RDX + 0x68) - *(int *)(ctx + 0x68);
  (this->dir0).y = iVar1 - iVar2;
  (this->dir0).z = (int)uVar6;
  (this->dir0).index = (int)(uVar6 >> 0x20);
  iVar1 = *(int *)(in_RCX + 0x6c);
  iVar2 = *(int *)(ctx + 0x6c);
  uVar6 = (ulong)(uint)(*(int *)(in_RCX + 0x70) - *(int *)(ctx + 0x70)) | 0xffffffff00000000;
  (this->dir1).x = *(int *)(in_RCX + 0x68) - *(int *)(ctx + 0x68);
  (this->dir1).y = iVar1 - iVar2;
  (this->dir1).z = (int)uVar6;
  (this->dir1).index = (int)(uVar6 >> 0x20);
  lVar3 = *(long *)(ctx + 0x20);
  pEVar7 = (EVP_PKEY_CTX *)(lVar3 + 0x10);
  if (lVar3 == 0) {
    pEVar7 = ctx + 0x18;
  }
  *(Face **)pEVar7 = this;
  *(Face **)(ctx + 0x20) = this;
  return (int)lVar3;
}

Assistant:

void init(Vertex* a, Vertex* b, Vertex* c)
				{
					nearbyVertex = a;
					origin = a->point;
					dir0 = *b - *a;
					dir1 = *c - *a;
					if (a->lastNearbyFace)
					{
						a->lastNearbyFace->nextWithSameNearbyVertex = this;
					}
					else
					{
						a->firstNearbyFace = this;
					}
					a->lastNearbyFace = this;
				}